

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap.hpp
# Opt level: O0

void __thiscall ot::commissioner::coap::OptionValue::OptionValue(OptionValue *this,uint32_t aUint32)

{
  iterator __first;
  iterator __last;
  value_type_conflict1 local_15;
  uint local_14;
  OptionValue *pOStack_10;
  uint32_t aUint32_local;
  OptionValue *this_local;
  
  local_14 = aUint32;
  pOStack_10 = this;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->mValue);
  for (; local_14 != 0; local_14 = local_14 >> 8) {
    local_15 = (value_type_conflict1)local_14;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(&this->mValue,&local_15);
  }
  __first = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(&this->mValue);
  __last = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(&this->mValue);
  std::
  reverse<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            ((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )__first._M_current,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )__last._M_current);
  return;
}

Assistant:

explicit OptionValue(uint32_t aUint32)
    {
        // Encoding an unsigned integer without preceding zeros.
        while (aUint32 != 0)
        {
            mValue.push_back(aUint32 & 0xff);
            aUint32 >>= 8;
        }
        std::reverse(mValue.begin(), mValue.end());
    }